

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_opl_mididevice.cpp
# Opt level: O3

void __thiscall OPLMIDIDevice::HandleEvent(OPLMIDIDevice *this,int status,int parm1,int parm2)

{
  int *piVar1;
  uint uVar2;
  uint channel;
  uint uVar3;
  
  uVar2 = status & 0xf;
  uVar3 = 9;
  if (uVar2 != 0xf) {
    uVar3 = uVar2;
  }
  channel = 0xf;
  if (uVar2 != 9) {
    channel = uVar3;
  }
  switch((status & 0xf0U) - 0x80 >> 4) {
  case 0:
    piVar1 = &(this->super_OPLmusicBlock).super_musicBlock.playingcount;
    *piVar1 = *piVar1 + -1;
    musicBlock::OPLreleaseNote(&(this->super_OPLmusicBlock).super_musicBlock,channel,(uchar)parm1);
    return;
  case 1:
    piVar1 = &(this->super_OPLmusicBlock).super_musicBlock.playingcount;
    *piVar1 = *piVar1 + 1;
    musicBlock::OPLplayNote
              (&(this->super_OPLmusicBlock).super_musicBlock,channel,(uchar)parm1,parm2);
    return;
  case 3:
    if (parm1 < 0x43) {
      switch(parm1) {
      case 0:
        musicBlock::OPLchangeControl
                  (&(this->super_OPLmusicBlock).super_musicBlock,channel,'\x01',parm2);
        return;
      case 1:
        musicBlock::OPLchangeControl
                  (&(this->super_OPLmusicBlock).super_musicBlock,channel,'\x02',parm2);
        return;
      case 2:
      case 3:
      case 4:
      case 5:
      case 8:
      case 9:
        break;
      case 6:
        musicBlock::OPLchangeControl
                  (&(this->super_OPLmusicBlock).super_musicBlock,channel,'\x0e',parm2);
        return;
      case 7:
        musicBlock::OPLchangeControl
                  (&(this->super_OPLmusicBlock).super_musicBlock,channel,'\x03',parm2);
        return;
      case 10:
        musicBlock::OPLchangeControl
                  (&(this->super_OPLmusicBlock).super_musicBlock,channel,'\x04',parm2);
        return;
      case 0xb:
        musicBlock::OPLchangeControl
                  (&(this->super_OPLmusicBlock).super_musicBlock,channel,'\x05',parm2);
        return;
      default:
        if (parm1 == 0x26) {
          musicBlock::OPLchangeControl
                    (&(this->super_OPLmusicBlock).super_musicBlock,channel,'\x0f',parm2);
          return;
        }
        if (parm1 == 0x40) {
          musicBlock::OPLchangeControl
                    (&(this->super_OPLmusicBlock).super_musicBlock,channel,'\b',parm2);
          return;
        }
      }
    }
    else {
      switch(parm1) {
      case 0x5b:
        musicBlock::OPLchangeControl
                  (&(this->super_OPLmusicBlock).super_musicBlock,channel,'\x06',parm2);
        return;
      case 0x5c:
      case 0x5e:
      case 0x5f:
      case 0x60:
      case 0x61:
        break;
      case 0x5d:
        musicBlock::OPLchangeControl
                  (&(this->super_OPLmusicBlock).super_musicBlock,channel,'\a',parm2);
        return;
      case 0x62:
        musicBlock::OPLchangeControl
                  (&(this->super_OPLmusicBlock).super_musicBlock,channel,'\r',parm2);
        return;
      case 99:
        musicBlock::OPLchangeControl
                  (&(this->super_OPLmusicBlock).super_musicBlock,channel,'\f',parm2);
        return;
      case 100:
        musicBlock::OPLchangeControl
                  (&(this->super_OPLmusicBlock).super_musicBlock,channel,'\v',parm2);
        return;
      case 0x65:
        musicBlock::OPLchangeControl
                  (&(this->super_OPLmusicBlock).super_musicBlock,channel,'\n',parm2);
        return;
      default:
        switch(parm1) {
        case 0x78:
          musicBlock::OPLchangeControl
                    (&(this->super_OPLmusicBlock).super_musicBlock,channel,'\x10',parm2);
          return;
        case 0x79:
          musicBlock::OPLresetControllers(&(this->super_OPLmusicBlock).super_musicBlock,channel,100)
          ;
          return;
        case 0x7a:
        case 0x7c:
        case 0x7d:
          break;
        case 0x7b:
          musicBlock::OPLchangeControl
                    (&(this->super_OPLmusicBlock).super_musicBlock,channel,'\x11',parm2);
          return;
        case 0x7e:
          musicBlock::OPLchangeControl
                    (&(this->super_OPLmusicBlock).super_musicBlock,channel,'\x12',parm2);
          return;
        case 0x7f:
          musicBlock::OPLchangeControl
                    (&(this->super_OPLmusicBlock).super_musicBlock,channel,'\x13',parm2);
          return;
        default:
          if (parm1 == 0x43) {
            musicBlock::OPLchangeControl
                      (&(this->super_OPLmusicBlock).super_musicBlock,channel,'\t',parm2);
            return;
          }
        }
      }
    }
    break;
  case 4:
    musicBlock::OPLprogramChange(&(this->super_OPLmusicBlock).super_musicBlock,channel,parm1);
    return;
  case 6:
    musicBlock::OPLpitchWheel
              (&(this->super_OPLmusicBlock).super_musicBlock,channel,parm2 << 7 | parm1);
    return;
  }
  return;
}

Assistant:

void OPLMIDIDevice::HandleEvent(int status, int parm1, int parm2)
{
	int command = status & 0xF0;
	int channel = status & 0x0F;

	// Swap channels 9 and 15, because their roles are reversed
	// in MUS and MIDI formats.
	if (channel == 9)
	{
		channel = 15;
	}
	else if (channel == 15)
	{
		channel = 9;
	}

	switch (command)
	{
	case MIDI_NOTEOFF:
		playingcount--;
		OPLreleaseNote(channel, parm1);
		break;

	case MIDI_NOTEON:
		playingcount++;
		OPLplayNote(channel, parm1, parm2);
		break;

	case MIDI_POLYPRESS:
		DEBUGOUT("Unhandled note aftertouch: Channel %d, note %d, value %d\n", channel, parm1, parm2);
		break;

	case MIDI_CTRLCHANGE:
		switch (parm1)
		{
		case 0:		OPLchangeControl(channel, ctrlBank, parm2);			break;
		case 1:		OPLchangeControl(channel, ctrlModulation, parm2);	break;
		case 6:		OPLchangeControl(channel, ctrlDataEntryHi, parm2);	break;
		case 7:		OPLchangeControl(channel, ctrlVolume, parm2);		break;
		case 10:	OPLchangeControl(channel, ctrlPan, parm2);			break;
		case 11:	OPLchangeControl(channel, ctrlExpression, parm2);	break;
		case 38:	OPLchangeControl(channel, ctrlDataEntryLo, parm2);	break;
		case 64:	OPLchangeControl(channel, ctrlSustainPedal, parm2);	break;
		case 67:	OPLchangeControl(channel, ctrlSoftPedal, parm2);	break;
		case 91:	OPLchangeControl(channel, ctrlReverb, parm2);		break;
		case 93:	OPLchangeControl(channel, ctrlChorus, parm2);		break;
		case 98:	OPLchangeControl(channel, ctrlNRPNLo, parm2);		break;
		case 99:	OPLchangeControl(channel, ctrlNRPNHi, parm2);		break;
		case 100:	OPLchangeControl(channel, ctrlRPNLo, parm2);		break;
		case 101:	OPLchangeControl(channel, ctrlRPNHi, parm2);		break;
		case 120:	OPLchangeControl(channel, ctrlSoundsOff, parm2);	break;
		case 121:	OPLresetControllers(channel, 100);					break;
		case 123:	OPLchangeControl(channel, ctrlNotesOff, parm2);		break;
		case 126:	OPLchangeControl(channel, ctrlMono, parm2);			break;
		case 127:	OPLchangeControl(channel, ctrlPoly, parm2);			break;
		default:
			DEBUGOUT("Unhandled controller: Channel %d, controller %d, value %d\n", channel, parm1, parm2);
			break;
		}
		break;

	case MIDI_PRGMCHANGE:
		OPLprogramChange(channel, parm1);
		break;

	case MIDI_CHANPRESS:
		DEBUGOUT("Unhandled channel aftertouch: Channel %d, value %d\n", channel, parm1, 0);
		break;

	case MIDI_PITCHBEND:
		OPLpitchWheel(channel, parm1 | (parm2 << 7));
		break;
	}
}